

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnExport
          (BinaryReaderInterp *this,Index index,ExternalKind kind,Index item_index,string_view name)

{
  ModuleDesc *pMVar1;
  string_view name_00;
  Index index_00;
  ExternalKind kind_00;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_160;
  allocator<char> local_151;
  string local_150;
  value_type local_130;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_100;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_f8;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_f0;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_e8;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_e0;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_d8;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> type;
  Location local_c0;
  Var local_a0;
  Location local_58;
  Enum local_38;
  Index local_34;
  ExternalKind local_30;
  Index item_index_local;
  ExternalKind kind_local;
  Index index_local;
  BinaryReaderInterp *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (BinaryReaderInterp *)name._M_len;
  local_34 = item_index;
  local_30 = kind;
  item_index_local = index;
  _kind_local = this;
  GetLocation(&local_58,this);
  kind_00 = local_30;
  index_00 = local_34;
  GetLocation(&local_c0,this);
  Var::Var(&local_a0,index_00,&local_c0);
  type._M_t.
  super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
  .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
        )(__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
          )this_local;
  name_00._M_str = (char *)name_local._M_len;
  name_00._M_len = (size_t)this_local;
  local_38 = (Enum)SharedValidator::OnExport(&this->validator_,&local_58,kind_00,&local_a0,name_00);
  bVar2 = Failed((Result)local_38);
  Var::~Var(&local_a0);
  if (bVar2) {
    Result::Result((Result *)((long)&name_local._M_str + 4),Error);
  }
  else {
    std::unique_ptr<wabt::interp::ExternType,std::default_delete<wabt::interp::ExternType>>::
    unique_ptr<std::default_delete<wabt::interp::ExternType>,void>
              ((unique_ptr<wabt::interp::ExternType,std::default_delete<wabt::interp::ExternType>> *
               )&local_d8);
    switch(local_30) {
    case First:
      pvVar3 = std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::
               operator[](&this->func_types_,(ulong)local_34);
      (*(pvVar3->super_ExternType)._vptr_ExternType[2])(&local_e0);
      std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
      operator=(&local_d8,&local_e0);
      std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
      ~unique_ptr(&local_e0);
      break;
    case Table:
      pvVar4 = std::vector<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>::
               operator[](&this->table_types_,(ulong)local_34);
      (*(pvVar4->super_ExternType)._vptr_ExternType[2])(&local_e8);
      std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
      operator=(&local_d8,&local_e8);
      std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
      ~unique_ptr(&local_e8);
      break;
    case Memory:
      pvVar5 = std::vector<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>::
               operator[](&this->memory_types_,(ulong)local_34);
      (*(pvVar5->super_ExternType)._vptr_ExternType[2])(&local_f0);
      std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
      operator=(&local_d8,&local_f0);
      std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
      ~unique_ptr(&local_f0);
      break;
    case Global:
      pvVar6 = std::vector<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>::
               operator[](&this->global_types_,(ulong)local_34);
      (*(pvVar6->super_ExternType)._vptr_ExternType[2])(&local_f8);
      std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
      operator=(&local_d8,&local_f8);
      std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
      ~unique_ptr(&local_f8);
      break;
    case Last:
      pvVar7 = std::vector<wabt::interp::TagType,_std::allocator<wabt::interp::TagType>_>::
               operator[](&this->tag_types_,(ulong)local_34);
      (*(pvVar7->super_ExternType)._vptr_ExternType[2])(&local_100);
      std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
      operator=(&local_d8,&local_100);
      std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
      ~unique_ptr(&local_100);
    }
    pMVar1 = this->module_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_150,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
               &local_151);
    std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
    unique_ptr(&local_160,&local_d8);
    ExportType::ExportType(&local_130.type,&local_150,&local_160);
    local_130.index = local_34;
    std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::push_back
              (&pMVar1->exports,&local_130);
    ExportDesc::~ExportDesc(&local_130);
    std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
    ~unique_ptr(&local_160);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator(&local_151);
    Result::Result((Result *)((long)&name_local._M_str + 4),Ok);
    std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
    ~unique_ptr(&local_d8);
  }
  return (Result)name_local._M_str._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnExport(Index index,
                                    ExternalKind kind,
                                    Index item_index,
                                    std::string_view name) {
  CHECK_RESULT(validator_.OnExport(GetLocation(), kind,
                                   Var(item_index, GetLocation()), name));

  std::unique_ptr<ExternType> type;
  switch (kind) {
    case ExternalKind::Func:   type = func_types_[item_index].Clone(); break;
    case ExternalKind::Table:  type = table_types_[item_index].Clone(); break;
    case ExternalKind::Memory: type = memory_types_[item_index].Clone(); break;
    case ExternalKind::Global: type = global_types_[item_index].Clone(); break;
    case ExternalKind::Tag:    type = tag_types_[item_index].Clone(); break;
  }
  module_.exports.push_back(
      ExportDesc{ExportType(std::string(name), std::move(type)), item_index});
  return Result::Ok;
}